

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O2

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  undefined4 extraout_var_01;
  undefined1 *in_RCX;
  BinaryComparisonExpression *comparison;
  long lVar7;
  
  uVar3 = (**(code **)(*(long *)__to + 0x18))(__to);
  switch(uVar3) {
  case 0:
  case 2:
    *in_RCX = 1;
    break;
  case 1:
    pcVar5 = (char *)(**(code **)(*(long *)__to + 0x48))(__to);
    iVar4 = link(this,__from,pcVar5);
    (**(code **)(*(long *)__to + 0x50))(__to,iVar4);
    break;
  case 3:
    plVar6 = (long *)(**(code **)(*(long *)__to + 0x50))(__to);
    lVar1 = plVar6[1];
    lVar2 = *plVar6;
    for (lVar7 = 0; lVar1 - lVar2 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      iVar4 = link(this,__from,*(char **)(*plVar6 + lVar7 * 8));
      *(ulong *)(*plVar6 + lVar7 * 8) = CONCAT44(extraout_var,iVar4);
    }
    break;
  case 4:
    pcVar5 = (char *)(**(code **)(*(long *)__to + 0x48))(__to);
    iVar4 = link(this,__from,pcVar5);
    (**(code **)(*(long *)__to + 0x50))(__to,iVar4);
    pcVar5 = (char *)(**(code **)(*(long *)__to + 0x58))(__to);
    iVar4 = link(this,__from,pcVar5);
    (**(code **)(*(long *)__to + 0x60))(__to,iVar4);
    break;
  case 5:
    plVar6 = (long *)(**(code **)(*(long *)__to + 0x50))(__to);
    lVar1 = plVar6[1];
    lVar2 = *plVar6;
    for (lVar7 = 0; lVar1 - lVar2 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      iVar4 = link(this,__from,*(char **)(*plVar6 + lVar7 * 8));
      *(ulong *)(*plVar6 + lVar7 * 8) = CONCAT44(extraout_var_00,iVar4);
    }
    break;
  case 6:
    plVar6 = (long *)(**(code **)(*(long *)__to + 0x38))(__to);
    lVar1 = plVar6[1];
    lVar2 = *plVar6;
    for (lVar7 = 0; lVar1 - lVar2 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      iVar4 = link(this,__from,*(char **)(*plVar6 + lVar7 * 8));
      *(ulong *)(*plVar6 + lVar7 * 8) = CONCAT44(extraout_var_01,iVar4);
    }
    break;
  case 7:
    pcVar5 = (char *)(**(code **)(*(long *)__to + 0x30))(__to);
    iVar4 = link(this,__from,pcVar5);
    (**(code **)(*(long *)__to + 0x38))(__to,iVar4);
    break;
  case 8:
    iVar4 = link(this,__from,__to);
    (**(code **)(*(long *)__to + 8))(__to);
    return iVar4;
  default:
    __to = (char *)0x0;
  }
  return (int)__to;
}

Assistant:

MathML::AST::INode* FormulasLinker::link( COLLADAFW::Formula* formula, MathML::AST::INode* astNode, bool& success)
	{
		switch ( astNode->getNodeType() )
		{
		case MathML::AST::INode::ARITHMETIC:
			{
				MathML::AST::ArithmeticExpression* arithmetic = (MathML::AST::ArithmeticExpression*)astNode;
				MathML::AST::NodeList& operands = arithmetic->getOperands();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::COMPARISON:
			{
				MathML::AST::BinaryComparisonExpression* comparison = (MathML::AST::BinaryComparisonExpression*)astNode;
				comparison->setLeftOperand(link(formula, comparison->getLeftOperand(), success));
				comparison->setRightOperand(link(formula, comparison->getRightOperand(), success));
			}
			return astNode;
		case MathML::AST::INode::CONSTANT:
		case MathML::AST::INode::VARIABLE:
			success = true;
			return astNode;
		case MathML::AST::INode::FRAGMENT:
			{
				MathML::AST::FragmentExpression* fragment = (MathML::AST::FragmentExpression*)astNode;
				fragment->setFragment( link( formula, fragment->getFragment(), success) );
			}
			return astNode;
		case MathML::AST::INode::LOGICAL:
			{
				MathML::AST::LogicExpression* logical = (MathML::AST::LogicExpression*)astNode;
				MathML::AST::NodeList& operands = logical->getOperands();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::UNARY:
			{
				MathML::AST::UnaryExpression* unary = (MathML::AST::UnaryExpression*)astNode;
				unary->setOperand(link(formula, unary->getOperand(), success));
			}
			return astNode;
		case MathML::AST::INode::FUNCTION:
			{
				MathML::AST::FunctionExpression* func = (MathML::AST::FunctionExpression*)astNode;
				MathML::AST::NodeList& operands = func->getParameterList();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::USERDEFINED:
			{
				COLLADACsymbol* csymbol = (COLLADACsymbol*) astNode;
				MathML::AST::INode* linkedNode = link( formula, csymbol, success );
				delete csymbol;
				return linkedNode;
			}
		default:
			COLLADABU_ASSERT(false);
		}
		return 0;
	}